

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O1

iterator * __thiscall ghc::filesystem::path::iterator::operator++(iterator *this)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var6;
  char *pcVar7;
  
  pcVar1 = (this->_iter)._M_current;
  pcVar2 = (this->_first)._M_current;
  pcVar3 = (this->_last)._M_current;
  pcVar4 = (this->_prefix)._M_current;
  _Var6._M_current = pcVar1;
  if (pcVar3 != pcVar1) {
    if (pcVar2 < pcVar4 && pcVar2 == pcVar1) {
      _Var6._M_current = (this->_prefix)._M_current;
    }
    else {
      pcVar5 = pcVar1 + 1;
      if (*pcVar1 == '/') {
        _Var6._M_current = pcVar5;
        if ((pcVar5 == pcVar3) || (*pcVar5 != '/')) goto LAB_0011e904;
        if ((pcVar2 != pcVar1 && pcVar4 != pcVar1) ||
           ((pcVar7 = pcVar1 + 2, pcVar7 != pcVar3 && (*pcVar7 == '/')))) {
          do {
            _Var6._M_current = pcVar5;
            if (*pcVar5 != '/') break;
            pcVar5 = pcVar5 + 1;
            _Var6._M_current = pcVar3;
          } while (pcVar5 != pcVar3);
          goto LAB_0011e904;
        }
      }
      else {
        pcVar7 = pcVar5;
        if (((pcVar2 == pcVar1 || pcVar4 == pcVar1) && pcVar5 != pcVar3) && (*pcVar5 == ':')) {
          _Var6._M_current = pcVar1 + 2;
          goto LAB_0011e904;
        }
      }
      _Var6 = std::
              __find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                        (pcVar7,pcVar3,&path_helper_base<char>::preferred_separator);
    }
  }
LAB_0011e904:
  pcVar1 = (this->_last)._M_current;
  do {
    (this->_iter)._M_current = _Var6._M_current;
    if (((_Var6._M_current == pcVar1) || (_Var6._M_current == (this->_root)._M_current)) ||
       (*_Var6._M_current != '/')) break;
    _Var6._M_current = _Var6._M_current + 1;
  } while (_Var6._M_current != pcVar1);
  updateCurrent(this);
  return this;
}

Assistant:

GHC_INLINE path::iterator& path::iterator::operator++()
{
    _iter = increment(_iter);
    while (_iter != _last &&                // we didn't reach the end
           _iter != _root &&                // this is not a root position
           *_iter == preferred_separator &&  // we are on a separator
           (_iter + 1) != _last             // the slash is not the last char
    ) {
        ++_iter;
    }
    updateCurrent();
    return *this;
}